

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.hpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
trial::protocol::bintoken::
format<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<char>>
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          bintoken *this,basic_variable<std::allocator<char>_> *data)

{
  undefined1 local_88 [8];
  writer writer;
  basic_variable<std::allocator<char>_> *data_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *result;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
  basic_writer<16ul>::basic_writer<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((basic_writer<16ul> *)local_88,__return_storage_ptr__);
  partial::format<std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)this,(writer *)local_88);
  basic_writer<16UL>::~basic_writer((basic_writer<16UL> *)local_88);
  return __return_storage_ptr__;
}

Assistant:

auto format(const trial::dynamic::basic_variable<Allocator>& data) -> T
{
    T result;
    bintoken::writer writer(result);
    partial::format(data, writer);
    return result;
}